

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O1

void __thiscall
helics::apps::Tracer::Tracer(Tracer *this,string_view appName,CoreApp *core,FederateInfo *fedInfo)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  
  apps::App::App(&this->super_App,appName,core,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Tracer_00522d00;
  this->printMessage = false;
  this->allow_iteration = false;
  this->skiplog = false;
  (this->cFilt)._M_t.
  super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
  super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl = (CloningFilter *)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  CLI::std::_Deque_base<helics::Input,_std::allocator<helics::Input>_>::_M_initialize_map
            (&(this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
             ,0);
  p_Var1 = &(this->subkeys)._M_t._M_impl.super__Rb_tree_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  CLI::std::_Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>::_M_initialize_map
            (&(this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>,0);
  p_Var1 = &(this->eptNames)._M_t._M_impl.super__Rb_tree_header;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->eptNames)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x88);
  if ((this->super_App).deactivated == false) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar2->super_ValueFederate)._vptr_ValueFederate[2])(peVar2,0,1);
    apps::App::loadInputFiles(&this->super_App);
  }
  return;
}

Assistant:

Tracer::Tracer(std::string_view appName, CoreApp& core, const FederateInfo& fedInfo):
    App(appName, core, fedInfo)
{
    initialSetup();
}